

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

Value MiniScript::Intrinsics::ListType(void)

{
  long *plVar1;
  List<MiniScript::FuncParam> *__s;
  byte bVar2;
  long lVar3;
  FunctionStorage *pFVar4;
  bool bVar5;
  uint uVar6;
  StringStorage *pSVar7;
  char *pcVar8;
  FunctionStorage *pFVar9;
  anon_union_8_3_2f476f46_for_data aVar10;
  _func_int **pp_Var11;
  undefined8 *puVar12;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  byte *in_RDI;
  bool *pbVar13;
  bool *pbVar14;
  Value VVar15;
  undefined1 local_148 [8];
  anon_union_8_3_2f476f46_for_data local_140;
  Value local_138;
  FunctionStorage *local_128;
  anon_union_8_3_2f476f46_for_data local_120;
  char local_118;
  String local_110;
  String local_100;
  String local_f0;
  String local_e0;
  String local_d0;
  String local_c0;
  String local_b0;
  String local_a0;
  String local_90;
  String local_80;
  String local_70;
  String local_60;
  String local_50;
  String local_40;
  
  if (_listType == 0) {
    Value::Value(&local_138,"hasIndex");
    local_40.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 9;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(9);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"hasIndex",9);
    local_40.ss = pSVar7;
    Intrinsic::GetByName(&local_40);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pFVar9 = (FunctionStorage *)operator_new(0x800);
    (pFVar9->super_RefCountedStorage).refCount = 1;
    (pFVar9->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__DictionaryStorage_001bf208;
    __s = &pFVar9->parameters;
    local_128 = pFVar9;
    memset(__s,0,0x7f0);
    pbVar13 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar14 = pbVar13;
    do {
      pbVar14 = *(bool **)pbVar14;
      if (pbVar14 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar13;
        *(undefined8 **)pbVar13 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00154f82;
      }
      bVar5 = Value::operator==((Value *)(pbVar14 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar14 + 0x18),(Value *)local_148);
LAB_00154f82:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_40.ss != (StringStorage *)0x0) && (local_40.isTemp == false)) {
      plVar1 = &((local_40.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_40.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_40.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"indexes");
    local_50.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 8;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(8);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"indexes",8);
    local_50.ss = pSVar7;
    Intrinsic::GetByName(&local_50);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_0015511b;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_0015511b:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_50.ss != (StringStorage *)0x0) && (local_50.isTemp == false)) {
      plVar1 = &((local_50.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"indexOf");
    local_60.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 8;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(8);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"indexOf",8);
    local_60.ss = pSVar7;
    Intrinsic::GetByName(&local_60);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_001552b4;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_001552b4:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_60.ss != (StringStorage *)0x0) && (local_60.isTemp == false)) {
      plVar1 = &((local_60.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_60.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_60.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"insert");
    local_70.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 7;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(7);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"insert",7);
    local_70.ss = pSVar7;
    Intrinsic::GetByName(&local_70);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_0015544d;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_0015544d:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_70.ss != (StringStorage *)0x0) && (local_70.isTemp == false)) {
      plVar1 = &((local_70.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_70.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_70.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"join");
    local_80.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 5;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(5);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"join",5);
    local_80.ss = pSVar7;
    Intrinsic::GetByName(&local_80);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_001555e3;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_001555e3:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_80.ss != (StringStorage *)0x0) && (local_80.isTemp == false)) {
      plVar1 = &((local_80.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_80.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_80.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"len");
    local_90.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 4;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(4);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"len",4);
    local_90.ss = pSVar7;
    Intrinsic::GetByName(&local_90);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00155775;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00155775:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_90.ss != (StringStorage *)0x0) && (local_90.isTemp == false)) {
      plVar1 = &((local_90.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_90.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_90.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"pop");
    local_a0.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 4;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(4);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"pop",4);
    local_a0.ss = pSVar7;
    Intrinsic::GetByName(&local_a0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00155907;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00155907:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_a0.ss != (StringStorage *)0x0) && (local_a0.isTemp == false)) {
      plVar1 = &((local_a0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_a0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_a0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"pull");
    local_b0.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 5;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(5);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"pull",5);
    local_b0.ss = pSVar7;
    Intrinsic::GetByName(&local_b0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00155a9d;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00155a9d:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
      plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"push");
    local_c0.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 5;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(5);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"push",5);
    local_c0.ss = pSVar7;
    Intrinsic::GetByName(&local_c0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00155c33;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00155c33:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_c0.ss != (StringStorage *)0x0) && (local_c0.isTemp == false)) {
      plVar1 = &((local_c0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_c0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_c0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"shuffle");
    local_d0.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 8;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(8);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"shuffle",8);
    local_d0.ss = pSVar7;
    Intrinsic::GetByName(&local_d0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00155dc9;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00155dc9:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_d0.ss != (StringStorage *)0x0) && (local_d0.isTemp == false)) {
      plVar1 = &((local_d0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_d0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_d0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"sort");
    local_e0.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 5;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(5);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"sort",5);
    local_e0.ss = pSVar7;
    Intrinsic::GetByName(&local_e0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00155f53;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00155f53:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_e0.ss != (StringStorage *)0x0) && (local_e0.isTemp == false)) {
      plVar1 = &((local_e0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_e0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_e0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"sum");
    local_f0.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 4;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(4);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"sum",4);
    local_f0.ss = pSVar7;
    Intrinsic::GetByName(&local_f0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_001560d6;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_001560d6:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_f0.ss != (StringStorage *)0x0) && (local_f0.isTemp == false)) {
      plVar1 = &((local_f0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_f0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_f0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"remove");
    local_100.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 7;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(7);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"remove",7);
    local_100.ss = pSVar7;
    Intrinsic::GetByName(&local_100);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_00156260;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_00156260:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_100.ss != (StringStorage *)0x0) && (local_100.isTemp == false)) {
      plVar1 = &((local_100.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_100.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_100.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"replace");
    local_110.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar7->dataSize = 8;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(8);
    pSVar7->data = pcVar8;
    builtin_strncpy(pcVar8,"replace",8);
    local_110.ss = pSVar7;
    Intrinsic::GetByName(&local_110);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_001563ea;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_001563ea:
    pFVar4 = local_128;
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_110.ss != (StringStorage *)0x0) && (local_110.isTemp == false)) {
      plVar1 = &((local_110.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_110.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_110.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    Value::Value(&local_138,"values");
    local_118 = '\0';
    aVar10.ref = (RefCountedStorage *)operator_new(0x30);
    (aVar10.ref)->refCount = 1;
    (aVar10.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar10.ref[1].refCount = 7;
    aVar10.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var11 = (_func_int **)operator_new__(7);
    aVar10.ref[1]._vptr_RefCountedStorage = pp_Var11;
    *(undefined4 *)((long)pp_Var11 + 3) = 0x736575;
    *(undefined4 *)pp_Var11 = 0x756c6176;
    local_120.ref = aVar10.ref;
    Intrinsic::GetByName((String *)&local_120);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    uVar6 = HashValue(&local_138);
    pbVar14 = &(pFVar9->parameters).isTemp + (ulong)(uVar6 % 0xfb) * 8;
    pbVar13 = pbVar14;
    do {
      pbVar13 = *(bool **)pbVar13;
      if (pbVar13 == (bool *)0x0) {
        puVar12 = (undefined8 *)operator_new(0x28);
        *(undefined2 *)(puVar12 + 3) = 0;
        *(undefined1 *)((long)puVar12 + 0x1a) = 0;
        *puVar12 = 0;
        *(undefined4 *)((long)puVar12 + 7) = 0;
        Value::operator=((Value *)(puVar12 + 1),&local_138);
        Value::operator=((Value *)(puVar12 + 3),(Value *)local_148);
        *puVar12 = *(undefined8 *)pbVar14;
        *(undefined8 **)pbVar14 = puVar12;
        __s->ls = (ListStorage<MiniScript::FuncParam> *)
                  ((long)&(__s->ls->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
        goto LAB_0015657a;
      }
      bVar5 = Value::operator==((Value *)(pbVar13 + 8),&local_138);
    } while (!bVar5);
    Value::operator=((Value *)(pbVar13 + 0x18),(Value *)local_148);
LAB_0015657a:
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_120.ref != (RefCountedStorage *)0x0) && (local_118 == '\0')) {
      plVar1 = &(local_120.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_120.ref)->_vptr_RefCountedStorage[1])();
      }
      local_120.number = 0.0;
    }
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
    }
    local_138.type = Map;
    local_138.noInvoke = false;
    local_138.localOnly = Off;
    local_138.data.ref = &pFVar4->super_RefCountedStorage;
    plVar1 = &(pFVar4->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
    Value::operator=((Value *)&_listType,&local_138);
    in_RDX = extraout_RDX;
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_00;
      }
    }
    plVar1 = &(pFVar4->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(pFVar4->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pFVar4);
      in_RDX = extraout_RDX_01;
    }
  }
  bVar2 = _listType;
  *in_RDI = _listType;
  in_RDI[1] = DAT_001c11a1;
  in_RDI[2] = DAT_001c11a2;
  lVar3 = DAT_001c11a8;
  *(long *)(in_RDI + 8) = DAT_001c11a8;
  VVar15.data._1_7_ = (undefined7)((ulong)in_RDX >> 8);
  VVar15.data._0_1_ = lVar3 == 0 || bVar2 < 3;
  if (lVar3 != 0 && bVar2 >= 3) {
    *(long *)(lVar3 + 8) = *(long *)(lVar3 + 8) + 1;
  }
  VVar15._0_8_ = in_RDI;
  return VVar15;
}

Assistant:

Value Intrinsics::ListType() {
		if (_listType.IsNull()) {
			ValueDict d;
			d.SetValue("hasIndex", Intrinsic::GetByName("hasIndex")->GetFunc());
			d.SetValue("indexes", Intrinsic::GetByName("indexes")->GetFunc());
			d.SetValue("indexOf",  Intrinsic::GetByName("indexOf")->GetFunc());
			d.SetValue("insert",  Intrinsic::GetByName("insert")->GetFunc());
			d.SetValue("join",  Intrinsic::GetByName("join")->GetFunc());
			d.SetValue("len",  Intrinsic::GetByName("len")->GetFunc());
			d.SetValue("pop",  Intrinsic::GetByName("pop")->GetFunc());
			d.SetValue("pull",  Intrinsic::GetByName("pull")->GetFunc());
			d.SetValue("push",  Intrinsic::GetByName("push")->GetFunc());
			d.SetValue("shuffle",  Intrinsic::GetByName("shuffle")->GetFunc());
			d.SetValue("sort",  Intrinsic::GetByName("sort")->GetFunc());
			d.SetValue("sum",  Intrinsic::GetByName("sum")->GetFunc());
			d.SetValue("remove",  Intrinsic::GetByName("remove")->GetFunc());
			d.SetValue("replace",  Intrinsic::GetByName("replace")->GetFunc());
			d.SetValue("values",  Intrinsic::GetByName("values")->GetFunc());
			_listType = d;
		}
		return _listType;
	}